

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

bool __thiscall
libtorrent::aux::torrent::create_peer_connection
          (torrent *this,torrent_peer *peerinfo,socket_type *socket,endpoint *endpoint)

{
  long *plVar1;
  session_interface *psVar2;
  undefined8 uVar3;
  element_type *this_00;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  peer_connection_interface *c_00;
  bool bVar5;
  _List_node_base *p_Var6;
  shared_ptr<libtorrent::aux::bt_peer_connection> c;
  shared_ptr<libtorrent::peer_plugin> pp;
  element_type *local_288;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_280;
  undefined1 local_278 [32];
  __shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2> local_258;
  __shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> local_248;
  peer_id our_pid;
  peer_connection_args pack;
  
  iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2e])();
  generate_peer_id(&our_pid,(session_settings *)CONCAT44(extraout_var,iVar4));
  pack.ses = (this->super_torrent_hot_members).m_ses;
  iVar4 = (*((pack.ses)->super_session_logger)._vptr_session_logger[0x2e])();
  pack.sett = (session_settings *)CONCAT44(extraout_var_00,iVar4);
  iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x4b])();
  pack.stats_counters = (counters *)CONCAT44(extraout_var_01,iVar4);
  iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [4])();
  pack.disk_thread = (disk_interface *)CONCAT44(extraout_var_02,iVar4);
  iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [7])();
  pack.ios = (io_context *)CONCAT44(extraout_var_03,iVar4);
  ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::aux::torrent,void>
            ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&c,
             (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
  ::std::__weak_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<libtorrent::aux::torrent,void>
            ((__weak_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&pack.tor,
             (__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&c);
  ::std::__detail::__variant::
  _Move_ctor_base<false,_libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
  ::_Move_ctor_base((_Move_ctor_base<false,_libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                     *)&pack.s,
                    (_Move_ctor_base<false,_libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                     *)socket);
  pack.endp.impl_.data_._0_8_ = *(undefined8 *)&(endpoint->impl_).data_;
  uVar3 = *(undefined8 *)((long)&(endpoint->impl_).data_ + 8);
  pack.endp.impl_.data_._20_8_ = *(undefined8 *)((long)&(endpoint->impl_).data_ + 0x14);
  pack.endp.impl_.data_._16_4_ =
       (undefined4)((ulong)*(undefined8 *)((long)&(endpoint->impl_).data_ + 0xc) >> 0x20);
  pack.endp.impl_.data_._8_4_ = (undefined4)uVar3;
  pack.endp.impl_.data_._12_4_ = (undefined4)((ulong)uVar3 >> 0x20);
  pack.our_peer_id.m_number._M_elems[0] = our_pid.m_number._M_elems[0];
  pack.our_peer_id.m_number._M_elems[1] = our_pid.m_number._M_elems[1];
  pack.our_peer_id.m_number._M_elems[2] = our_pid.m_number._M_elems[2];
  pack.our_peer_id.m_number._M_elems[3] = our_pid.m_number._M_elems[3];
  pack.our_peer_id.m_number._M_elems[4] = our_pid.m_number._M_elems[4];
  pack.peerinfo = peerinfo;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c.super___shared_ptr<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::make_shared<libtorrent::aux::bt_peer_connection,libtorrent::aux::peer_connection_args&>
            ((peer_connection_args *)&c);
  (*((c.super___shared_ptr<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0xf])
            (c.super___shared_ptr<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(ulong)peerinfo->prev_amount_download << 10,
             (ulong)peerinfo->prev_amount_upload << 10);
  peerinfo->prev_amount_upload = 0;
  peerinfo->prev_amount_download = 0;
  p_Var6 = (_List_node_base *)&this->m_extensions;
  local_278._24_8_ = peerinfo;
  while (p_Var6 = (((_List_base<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
                     *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var6 != (_List_node_base *)&this->m_extensions) {
    plVar1 = (long *)p_Var6[1]._M_next;
    ::std::__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::aux::peer_connection,void>
              ((__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)
               &local_248,
               (__weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
               &((c.
                  super___shared_ptr<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_peer_connection).
                super_enable_shared_from_this<libtorrent::aux::peer_connection>);
    ::std::__weak_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<libtorrent::aux::peer_connection,void>
              ((__weak_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)&local_288
               ,&local_248);
    local_278._0_8_ = local_288;
    local_278._8_8_ = _Stack_280._M_pi;
    local_288 = (element_type *)0x0;
    _Stack_280._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (**(code **)(*plVar1 + 0x10))
              (&pp.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>,plVar1,
               local_278);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_278 + 8));
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_280);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_248._M_refcount);
    this_00 = c.super___shared_ptr<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (pp.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      ::std::__shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_258,
                 &pp.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>);
      peer_connection::add_extension
                (&this_00->super_peer_connection,(shared_ptr<libtorrent::peer_plugin> *)&local_258);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_258._M_refcount);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pp.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  ::std::
  vector<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
  ::reserve(&this->m_peers_to_disconnect,
            ((long)(this->super_torrent_hot_members).m_connections.
                   super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   .
                   super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_torrent_hot_members).m_connections.
                   super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   .
                   super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) + 1);
  uVar3 = local_278._24_8_;
  sorted_insert<libtorrent::aux::peer_connection*,libtorrent::aux::bt_peer_connection*>
            (&(this->super_torrent_hot_members).m_connections.
              super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             ,c.super___shared_ptr<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr);
  ::std::
  _Rb_tree<libtorrent::digest32<160l>,libtorrent::digest32<160l>,std::_Identity<libtorrent::digest32<160l>>,std::less<libtorrent::digest32<160l>>,std::allocator<libtorrent::digest32<160l>>>
  ::_M_insert_unique<libtorrent::digest32<160l>const&>
            ((_Rb_tree<libtorrent::digest32<160l>,libtorrent::digest32<160l>,std::_Identity<libtorrent::digest32<160l>>,std::less<libtorrent::digest32<160l>>,std::allocator<libtorrent::digest32<160l>>>
              *)&this->m_outgoing_pids,&our_pid);
  psVar2 = (this->super_torrent_hot_members).m_ses;
  ::std::__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::aux::bt_peer_connection,void>
            ((__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)&pp,
             &c.super___shared_ptr<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2>)
  ;
  (*(psVar2->super_session_logger)._vptr_session_logger[10])
            (psVar2,(__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)&pp
            );
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&pp.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  need_peer_list(this);
  c_00 = &((c.super___shared_ptr<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->super_peer_connection).super_peer_connection_interface;
  if (c.super___shared_ptr<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    c_00 = (peer_connection_interface *)0x0;
  }
  peer_list::set_connection
            ((this->super_torrent_hot_members).m_peer_list._M_t.
             super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
             ._M_t.
             super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
             .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl,
             (torrent_peer *)uVar3,c_00);
  if ((*(byte *)(uVar3 + 0x1b) & 0x80) != 0) {
    this->m_num_seeds = this->m_num_seeds + 1;
  }
  update_want_peers(this);
  update_want_tick(this);
  (*((c.super___shared_ptr<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[5])();
  iVar4 = (*((c.super___shared_ptr<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[1])();
  if ((char)iVar4 == '\0') {
    bVar5 = true;
    if (((this->super_torrent_hot_members).field_0x4b & 0x20) != 0) {
      recalc_share_mode(this);
    }
  }
  else {
    bVar5 = false;
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c.super___shared_ptr<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peer_connection_args::~peer_connection_args(&pack);
  return bVar5;
}

Assistant:

bool torrent::create_peer_connection(torrent_peer* peerinfo, aux::socket_type socket, tcp::endpoint endpoint)
	{
		peer_id const our_pid = aux::generate_peer_id(settings());
		peer_connection_args pack{
			&m_ses
			, &settings()
			, &m_ses.stats_counters()
			, &m_ses.disk_thread()
			, &m_ses.get_context()
			, shared_from_this()
			, std::move(socket)
			, std::move(endpoint)
			, peerinfo
			, our_pid
		};

		auto c = std::make_shared<bt_peer_connection>(pack);

#if TORRENT_USE_ASSERTS
		c->m_in_constructor = false;
#endif

		c->add_stat(std::int64_t(peerinfo->prev_amount_download) * 1024
			, std::int64_t(peerinfo->prev_amount_upload) * 1024);
		peerinfo->prev_amount_download = 0;
		peerinfo->prev_amount_upload = 0;

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& ext : m_extensions)
		{
			std::shared_ptr<peer_plugin> pp(ext->new_connection(
					peer_connection_handle(c->self())));
			if (pp) c->add_extension(pp);
		}
#endif

		// add the newly connected peer to this torrent's peer list
		TORRENT_ASSERT(m_iterating_connections == 0);

		// we don't want to have to allocate memory to disconnect this peer, so
		// make sure there's enough memory allocated in the deferred_disconnect
		// list up-front
		m_peers_to_disconnect.reserve(m_connections.size() + 1);

		sorted_insert(m_connections, c.get());
		try
		{
			m_outgoing_pids.insert(our_pid);
			m_ses.insert_peer(c);
			need_peer_list();
			m_peer_list->set_connection(peerinfo, c.get());
			if (peerinfo->seed)
			{
				TORRENT_ASSERT(m_num_seeds < 0xffff);
				++m_num_seeds;
			}
			update_want_peers();
			update_want_tick();
			c->start();

			if (c->is_disconnecting()) return false;
		}
		catch (std::exception const&)
		{
			TORRENT_ASSERT(m_iterating_connections == 0);
			c->disconnect(errors::no_error, operation_t::bittorrent, peer_connection_interface::failure);
			return false;
		}

#ifndef TORRENT_DISABLE_SHARE_MODE
		if (m_share_mode)
			recalc_share_mode();
#endif
		return true;
	}